

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

ssize_t __thiscall
cpp_client::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Head_base<0UL,_cpp_client::Connection_internal_*,_false> _Var1;
  long lVar2;
  ostream *poVar3;
  ssize_t sVar4;
  size_t __n_00;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  uVar5 = CONCAT44(in_register_00000034,__fd);
  lVar2 = std::chrono::_V2::system_clock::now();
  if (this->print_communication_ == true) {
    poVar3 = ::operator<<((ostream *)&std::cout,text_magenta);
    poVar3 = std::operator<<(poVar3,"TO SERVER --> ");
    std::__cxx11::string::substr((ulong)&bStack_88,uVar5);
    poVar3 = std::operator<<(poVar3,(string *)&bStack_88);
    poVar3 = std::operator<<(poVar3,", \"sentTime\": ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,"}");
    poVar3 = ::operator<<(poVar3,normal);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&bStack_88);
  }
  _Var1._M_head_impl =
       (this->conn_)._M_t.
       super___uniq_ptr_impl<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
       ._M_t.
       super__Tuple_impl<0UL,_cpp_client::Connection_internal_*,_std::default_delete<cpp_client::Connection_internal>_>
       .super__Head_base<0UL,_cpp_client::Connection_internal_*,_false>._M_head_impl;
  __n_00 = *(long *)(uVar5 + 8) - 1;
  std::__cxx11::string::substr((ulong)&bStack_88,uVar5);
  Connection_internal::send(_Var1._M_head_impl,(int)&bStack_88,__buf_00,__n_00,__flags);
  std::__cxx11::string::~string((string *)&bStack_88);
  _Var1._M_head_impl =
       (this->conn_)._M_t.
       super___uniq_ptr_impl<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
       ._M_t.
       super__Tuple_impl<0UL,_cpp_client::Connection_internal_*,_std::default_delete<cpp_client::Connection_internal>_>
       .super__Head_base<0UL,_cpp_client::Connection_internal_*,_false>._M_head_impl;
  std::__cxx11::to_string(&local_48,lVar2 / 1000000);
  std::operator+(&local_68,", \"sentTime\": ",&local_48);
  std::operator+(&bStack_88,&local_68,"}\x04");
  Connection_internal::send(_Var1._M_head_impl,(int)&bStack_88,__buf_01,__n_00,__flags);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_68);
  sVar4 = std::__cxx11::string::~string((string *)&local_48);
  return sVar4;
}

Assistant:

void Connection::send(const std::string& msg)
{
   using namespace std::chrono;
   const auto time = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
   if(print_communication_)
   {
      std::cout << sgr::text_magenta
                << "TO SERVER --> "
                << msg.substr(0, msg.size() - 1)
                << ", \"sentTime\": "
                << time << "}"
                << sgr::reset
                << '\n';
   }
   //cut out the last } and append the time sent
   conn_->send(msg.substr(0, msg.size() - 1));
   conn_->send(R"(, "sentTime": )" + std::to_string(time) + "}\x04");
}